

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

CTcLabelFixup * __thiscall CTcCodeStream::alloc_fixup(CTcCodeStream *this)

{
  long in_RDI;
  CTcLabelFixup *ret;
  CTcPrsMem *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  undefined8 local_10;
  
  if (*(long *)(in_RDI + 0x78) == 0) {
    local_10 = (CTcLabelFixup *)
               CTcCSPrsAllocObj::operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    CTcLabelFixup::CTcLabelFixup(local_10);
    if (local_10 == (CTcLabelFixup *)0x0) {
      err_throw(0);
    }
  }
  else {
    local_10 = *(CTcLabelFixup **)(in_RDI + 0x78);
    *(undefined8 *)(in_RDI + 0x78) = **(undefined8 **)(in_RDI + 0x78);
  }
  return local_10;
}

Assistant:

CTcLabelFixup *CTcCodeStream::alloc_fixup()
{
    CTcLabelFixup *ret;

    /* if there's anything in the free list, use it */
    if (free_fixup_ != 0)
    {
        /* take the first one off the free list */
        ret = free_fixup_;

        /* unlink it from the list */
        free_fixup_ = free_fixup_->nxt;
    }
    else
    {
        /* allocate a new fixup */
        ret = new (allocator_) CTcLabelFixup;

        /* throw an error if allocation failed */
        if (ret == 0)
            err_throw(TCERR_CODEGEN_NO_MEM);
    }

    /* return the allocated fixup */
    return ret;
}